

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

string * __thiscall
booster::locale::impl_std::utf8_numpunct_from_wide::do_truename_abi_cxx11_
          (string *__return_storage_ptr__,utf8_numpunct_from_wide *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->truename_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->truename_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string do_truename() const
    {
        return truename_;
    }